

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O0

void strict_fstream::detail::static_method_holder::check_open
               (ios *s_p,string *filename,openmode mode)

{
  ulong uVar1;
  undefined8 uVar2;
  int __errnum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 uVar3;
  Exception *in_stack_fffffffffffffed0;
  openmode in_stack_fffffffffffffedc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined1 local_d9 [97];
  undefined1 local_78 [120];
  
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    return;
  }
  uVar3 = 1;
  uVar2 = __cxa_allocate_exception(0x28);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_d9 + 1),"strict_fstream: open(\'",(allocator *)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,in_stack_fffffffffffffec8),__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,in_stack_fffffffffffffec8),(char *)__rhs);
  mode_to_string_abi_cxx11_(in_stack_fffffffffffffedc);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  __errnum = (int)local_78;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,in_stack_fffffffffffffec8),(char *)__rhs);
  strerror_abi_cxx11_((strict_fstream *)&stack0xfffffffffffffed0,__errnum);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  Exception::Exception
            (in_stack_fffffffffffffed0,(string *)CONCAT17(uVar3,in_stack_fffffffffffffec8));
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void check_open(std::ios * s_p, const std::string& filename, std::ios_base::openmode mode)
    {
        if (s_p->fail())
        {
            throw Exception(std::string("strict_fstream: open('")
                            + filename + "'," + mode_to_string(mode) + "): open failed: "
                            + strerror());
        }
    }